

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeCompiler.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  _Bool _Var1;
  _Bool _Var2;
  sysbvm_tuple_t *psVar3;
  size_t slotCount;
  sysbvm_tuple_t sVar4;
  sysbvm_tuple_t sVar5;
  sysbvm_bitflags_t sVar6;
  _Bool isNotypecheck;
  sysbvm_bitflags_t applicationFlags;
  _Bool isControlFlowEscape;
  size_t sStack_c8;
  _Bool isVoidType;
  size_t i_1;
  size_t i;
  size_t applicationArgumentCount;
  sysbvm_stackFrameGCRootsRecord_t gcFrameRecord;
  anon_struct_72_9_95a0e576 gcFrame;
  sysbvm_astFunctionApplicationNode_t **applicationNode;
  sysbvm_functionBytecodeDirectCompiler_t **compiler;
  sysbvm_tuple_t *node;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 2) {
    sysbvm_error_argumentCountMismatch(2,argumentCount);
  }
  psVar3 = arguments + 1;
  memset(&gcFrameRecord.roots,0,0x48);
  memset(&applicationArgumentCount,0,0x20);
  gcFrameRecord.previous._0_4_ = 0;
  gcFrameRecord.type = SYSBVM_STACK_FRAME_RECORD_TYPE_COUNT;
  gcFrameRecord._12_4_ = 0;
  gcFrameRecord.rootCount = (size_t)&gcFrameRecord.roots;
  sysbvm_stackFrame_pushRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  slotCount = sysbvm_array_getSize(*(sysbvm_tuple_t *)(*arguments + 0x30));
  gcFrameRecord.roots =
       (sysbvm_tuple_t *)
       sysbvm_functionBytecodeDirectCompiler_compileASTNode
                 (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,
                  *(sysbvm_tuple_t *)(*arguments + 0x28));
  sVar4 = sysbvm_functionBytecodeAssembler_getLiteralFunctionPrimitiveName
                    (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
                     (sysbvm_tuple_t)gcFrameRecord.roots);
  if (sVar4 == (context->roots).anyValueToVoidPrimitiveName) {
    for (i_1 = 0; i_1 < slotCount; i_1 = i_1 + 1) {
      sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),i_1);
      sysbvm_functionBytecodeDirectCompiler_compileASTNode
                (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,sVar4);
    }
    context_local =
         (sysbvm_context_t *)
         sysbvm_functionBytecodeAssembler_addLiteral
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),0x2f);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  }
  else if ((sVar4 == (context->roots).pointerLikeLoadPrimitiveName) && (slotCount == 1)) {
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),0);
    sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,sVar4);
    context_local =
         (sysbvm_context_t *)
         sysbvm_functionBytecodeAssembler_newTemporary
                   (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
                    *(sysbvm_tuple_t *)(*arguments + 0x20));
    sysbvm_functionBytecodeAssembler_load
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
               (sysbvm_tuple_t)context_local,sVar4);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  }
  else if ((sVar4 == (context->roots).pointerLikeStorePrimitiveName) && (slotCount == 2)) {
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),0);
    context_local =
         (sysbvm_context_t *)
         sysbvm_functionBytecodeDirectCompiler_compileASTNode
                   (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,sVar4);
    sVar4 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),1);
    sVar4 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                      (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,sVar4);
    sysbvm_functionBytecodeAssembler_store
              (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
               (sysbvm_tuple_t)context_local,sVar4);
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
  }
  else {
    sVar4 = sysbvm_array_create(context,slotCount);
    for (sStack_c8 = 0; sStack_c8 < slotCount; sStack_c8 = sStack_c8 + 1) {
      sVar5 = sysbvm_array_at(*(sysbvm_tuple_t *)(*arguments + 0x30),sStack_c8);
      sVar5 = sysbvm_functionBytecodeDirectCompiler_compileASTNode
                        (context,(sysbvm_functionBytecodeDirectCompiler_t *)*psVar3,sVar5);
      sysbvm_array_atPut(sVar4,sStack_c8,sVar5);
    }
    _Var1 = sysbvm_type_isDirectSubtypeOf
                      (*(sysbvm_tuple_t *)(*arguments + 0x20),(context->roots).voidType);
    _Var2 = sysbvm_type_isDirectSubtypeOf
                      (*(sysbvm_tuple_t *)(*arguments + 0x20),(context->roots).controlFlowEscapeType
                      );
    if (_Var1) {
      gcFrame.result = 0;
      gcFrame.argumentOperand =
           sysbvm_functionBytecodeAssembler_addLiteral
                     (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),0x2f);
    }
    else {
      gcFrame.argumentOperand =
           sysbvm_functionBytecodeAssembler_newTemporary
                     (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),
                      *(sysbvm_tuple_t *)(*arguments + 0x20));
      gcFrame.result = gcFrame.argumentOperand;
    }
    sVar6 = sysbvm_tuple_bitflags_decode(*(sysbvm_tuple_t *)(*arguments + 0x38));
    if ((sVar6 & 1) == 0) {
      sysbvm_functionBytecodeAssembler_call
                (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),gcFrame.result,
                 (sysbvm_tuple_t)gcFrameRecord.roots,sVar4);
    }
    else {
      sysbvm_functionBytecodeAssembler_uncheckedCall
                (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10),gcFrame.result,
                 (sysbvm_tuple_t)gcFrameRecord.roots,sVar4);
    }
    if (_Var2) {
      sysbvm_functionBytecodeAssembler_unreachable
                (context,*(sysbvm_functionBytecodeAssembler_t **)(*psVar3 + 0x10));
    }
    sysbvm_stackFrame_popRecord((sysbvm_stackFrameRecord_t *)&applicationArgumentCount);
    context_local = (sysbvm_context_t *)gcFrame.argumentOperand;
  }
  return (sysbvm_tuple_t)context_local;
}

Assistant:

static sysbvm_tuple_t sysbvm_astFunctionApplicationNode_primitiveCompileIntoBytecode(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 2) sysbvm_error_argumentCountMismatch(2, argumentCount);

    sysbvm_tuple_t *node = &arguments[0];
    sysbvm_functionBytecodeDirectCompiler_t **compiler = (sysbvm_functionBytecodeDirectCompiler_t **)&arguments[1];

    sysbvm_astFunctionApplicationNode_t **applicationNode = (sysbvm_astFunctionApplicationNode_t**)node;
    struct {
        sysbvm_tuple_t function;
        sysbvm_tuple_t primitiveName;
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t argumentNode;
        sysbvm_tuple_t argumentOperand;
        sysbvm_tuple_t result;
        sysbvm_tuple_t resultTemporary;

        sysbvm_tuple_t pointerOperand;
        sysbvm_tuple_t valueOperand;
    } gcFrame = {0};
    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);

    size_t applicationArgumentCount = sysbvm_array_getSize((*applicationNode)->arguments);

    gcFrame.function = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, (*applicationNode)->functionExpression);

    // Inline some special functions here.
    gcFrame.primitiveName = sysbvm_functionBytecodeAssembler_getLiteralFunctionPrimitiveName(context, (*compiler)->assembler, gcFrame.function);
    if(gcFrame.primitiveName == context->roots.anyValueToVoidPrimitiveName)
    {
        for(size_t i = 0; i < applicationArgumentCount; ++i)
        {
            gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
            sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        }

        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeLoadPrimitiveName && applicationArgumentCount == 1)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.result = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        sysbvm_functionBytecodeAssembler_load(context, (*compiler)->assembler, gcFrame.result, gcFrame.pointerOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.result;
    }
    else if(gcFrame.primitiveName == context->roots.pointerLikeStorePrimitiveName && applicationArgumentCount == 2)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 0);
        gcFrame.pointerOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, 1);
        gcFrame.valueOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);

        sysbvm_functionBytecodeAssembler_store(context, (*compiler)->assembler, gcFrame.pointerOperand, gcFrame.valueOperand);
        SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
        return gcFrame.pointerOperand;
    }

    gcFrame.arguments = sysbvm_array_create(context, applicationArgumentCount);

    for(size_t i = 0; i < applicationArgumentCount; ++i)
    {
        gcFrame.argumentNode = sysbvm_array_at((*applicationNode)->arguments, i);
        gcFrame.argumentOperand = sysbvm_functionBytecodeDirectCompiler_compileASTNode(context, *compiler, gcFrame.argumentNode);
        sysbvm_array_atPut(gcFrame.arguments, i, gcFrame.argumentOperand);
    }

    bool isVoidType = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.voidType);
    bool isControlFlowEscape = sysbvm_type_isDirectSubtypeOf((*applicationNode)->super.analyzedType, context->roots.controlFlowEscapeType);
    if(isVoidType)
    {
        gcFrame.resultTemporary = SYSBVM_NULL_TUPLE;
        gcFrame.result = sysbvm_functionBytecodeAssembler_addLiteral(context, (*compiler)->assembler, SYSBVM_VOID_TUPLE);
    }
    else
    {
        gcFrame.resultTemporary = sysbvm_functionBytecodeAssembler_newTemporary(context, (*compiler)->assembler, (*applicationNode)->super.analyzedType);
        gcFrame.result = gcFrame.resultTemporary;
    }

    sysbvm_bitflags_t applicationFlags = sysbvm_tuple_bitflags_decode((*applicationNode)->applicationFlags);
    bool isNotypecheck = (applicationFlags & SYSBVM_FUNCTION_APPLICATION_FLAGS_NO_TYPECHECK) != 0;

    if(isNotypecheck)
        sysbvm_functionBytecodeAssembler_uncheckedCall(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);
    else
        sysbvm_functionBytecodeAssembler_call(context, (*compiler)->assembler, gcFrame.resultTemporary, gcFrame.function, gcFrame.arguments);

    if(isControlFlowEscape)
        sysbvm_functionBytecodeAssembler_unreachable(context, (*compiler)->assembler);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}